

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
::visit_byte_string(basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
                    *this,byte_string_view *b,uint64_t ext_tag,ser_context *param_4,
                   error_code *param_5)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  iterator this_00;
  pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long> *__args;
  undefined1 uVar4;
  byte_string_view *in_RSI;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>,_bool>
  pVar5;
  iterator it;
  byte_string_type bs;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  _Rb_tree_iterator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>
  in_stack_ffffffffffffff10;
  uint8_t *in_stack_ffffffffffffff18;
  basic_byte_string<std::allocator<unsigned_char>_> *in_stack_ffffffffffffff20;
  uint64_t in_stack_ffffffffffffff58;
  basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
  *in_stack_ffffffffffffff60;
  _Rb_tree_iterator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>
  this_01;
  byte_string_view *in_stack_ffffffffffffff88;
  basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
  *in_stack_ffffffffffffff90;
  _Self local_68;
  _Self local_60 [10];
  byte_string_view *local_10;
  
  local_10 = in_RSI;
  bVar1 = cbor_encode_options::pack_strings((cbor_encode_options *)(in_RDI + 0x10));
  if (bVar1) {
    sVar2 = byte_string_view::size(local_10);
    sVar3 = detail::min_length_for_stringref(*(uint64_t *)(in_RDI + 0xb0));
    if (sVar3 <= sVar2) {
      byte_string_view::data(local_10);
      byte_string_view::size(local_10);
      std::allocator<unsigned_char>::allocator<char>
                ((allocator<unsigned_char> *)in_stack_ffffffffffffff10._M_node,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      basic_byte_string<std::allocator<unsigned_char>_>::basic_byte_string
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (size_t)in_stack_ffffffffffffff10._M_node,
                 (allocator<unsigned_char> *)
                 CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2d65bf);
      this_00 = std::
                map<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
                ::find((map<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                       (key_type *)0x2d65d5);
      local_60[0]._M_node = this_00._M_node;
      local_68._M_node =
           (_Base_ptr)
           std::
           map<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
           ::end((map<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      bVar1 = std::operator==(local_60,&local_68);
      if (bVar1) {
        __args = (pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long> *
                 )(in_RDI + 0x80);
        *(long *)(in_RDI + 0xb0) = *(long *)(in_RDI + 0xb0) + 1;
        std::make_pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>&,unsigned_long>
                  ((basic_byte_string<std::allocator<unsigned_char>_> *)__args,
                   (unsigned_long *)in_stack_ffffffffffffff10._M_node);
        pVar5 = std::
                map<jsoncons::basic_byte_string<std::allocator<unsigned_char>>,unsigned_long,std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>>>,std::allocator<std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>const,unsigned_long>>>
                ::
                emplace<std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>>,unsigned_long>>
                          ((map<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long,_std::less<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>_>
                            *)this_00._M_node,__args);
        in_stack_ffffffffffffff10 = pVar5.first._M_node;
        uVar4 = pVar5.second;
        this_01._M_node = in_stack_ffffffffffffff10._M_node;
        std::pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>::~pair
                  ((pair<jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>
                    *)0x2d6699);
        write_tag((basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
                   *)this_01._M_node,in_stack_ffffffffffffff58);
        byte_string_view::byte_string_view<std::allocator<unsigned_char>>
                  ((byte_string_view *)in_stack_ffffffffffffff10._M_node,
                   (basic_byte_string<std::allocator<unsigned_char>_> *)
                   CONCAT17(uVar4,in_stack_ffffffffffffff08));
        write_byte_string(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      else {
        write_tag(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        std::
        _Rb_tree_iterator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>
        ::operator*((_Rb_tree_iterator<std::pair<const_jsoncons::basic_byte_string<std::allocator<unsigned_char>_>,_unsigned_long>_>
                     *)0x2d6751);
        write_uint64_value(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
      basic_byte_string<std::allocator<unsigned_char>_>::~basic_byte_string
                ((basic_byte_string<std::allocator<unsigned_char>_> *)0x2d6770);
      goto LAB_002d67a5;
    }
  }
  write_tag(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  write_byte_string(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
LAB_002d67a5:
  end_value((basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
             *)in_stack_ffffffffffffff10._M_node);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_byte_string(const byte_string_view& b, 
                           uint64_t ext_tag, 
                           const ser_context&,
                           std::error_code&) override
    {
        if (options_.pack_strings() && b.size() >= jsoncons::cbor::detail::min_length_for_stringref(next_stringref_))
        {
            byte_string_type bs(b.data(), b.size(), alloc_);
            auto it = bytestringref_map_.find(bs);
            if (it == bytestringref_map_.end())
            {
                bytestringref_map_.emplace(std::make_pair(bs, next_stringref_++));
                write_tag(ext_tag);
                write_byte_string(bs);
            }
            else
            {
                write_tag(25);
                write_uint64_value((*it).second);
            }
        }
        else
        {
            write_tag(ext_tag);
            write_byte_string(b);
        }

        end_value();
        JSONCONS_VISITOR_RETURN;
    }